

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::RenderFrame(ImVec2 p_min,ImVec2 p_max,ImU32 fill_col,bool border,float rounding)

{
  float thickness;
  ImGuiWindow *pIVar1;
  ImDrawList *pIVar2;
  ImGuiContext *pIVar3;
  ImU32 IVar4;
  undefined7 in_register_00000031;
  ImVec2 p_min_local;
  ImVec2 p_max_local;
  ImVec2 local_40;
  ImVec2 local_38;
  
  pIVar3 = GImGui;
  pIVar1 = GImGui->CurrentWindow;
  p_min_local = p_min;
  p_max_local = p_max;
  ImDrawList::AddRectFilled(pIVar1->DrawList,&p_min_local,&p_max_local,fill_col,rounding,0xf);
  if (((int)CONCAT71(in_register_00000031,border) != 0) &&
     (thickness = (pIVar3->Style).FrameBorderSize, 0.0 < thickness)) {
    pIVar2 = pIVar1->DrawList;
    local_38.x = p_min_local.x + 1.0;
    local_38.y = p_min_local.y + 1.0;
    local_40.x = p_max_local.x + 1.0;
    local_40.y = p_max_local.y + 1.0;
    IVar4 = GetColorU32(6,1.0);
    ImDrawList::AddRect(pIVar2,&local_38,&local_40,IVar4,rounding,0xf,thickness);
    pIVar2 = pIVar1->DrawList;
    IVar4 = GetColorU32(5,1.0);
    ImDrawList::AddRect(pIVar2,&p_min_local,&p_max_local,IVar4,rounding,0xf,thickness);
  }
  return;
}

Assistant:

void ImGui::RenderFrame(ImVec2 p_min, ImVec2 p_max, ImU32 fill_col, bool border, float rounding)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    window->DrawList->AddRectFilled(p_min, p_max, fill_col, rounding);
    const float border_size = g.Style.FrameBorderSize;
    if (border && border_size > 0.0f)
    {
        window->DrawList->AddRect(p_min+ImVec2(1,1), p_max+ImVec2(1,1), GetColorU32(ImGuiCol_BorderShadow), rounding, ImDrawCornerFlags_All, border_size);
        window->DrawList->AddRect(p_min, p_max, GetColorU32(ImGuiCol_Border), rounding, ImDrawCornerFlags_All, border_size);
    }
}